

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_context_output(jx9_context *pCtx,char *zString,int nLen)

{
  jx9_vm *pjVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  if (nLen < 0) {
    pcVar4 = zString;
    if (*zString != '\0') {
      pcVar2 = zString + 2;
      do {
        pcVar4 = pcVar2;
        if (pcVar4[-1] == '\0') {
          pcVar4 = pcVar4 + -1;
          goto LAB_0010d41c;
        }
        if (*pcVar4 == '\0') goto LAB_0010d41c;
        if (pcVar4[1] == '\0') {
          pcVar4 = pcVar4 + 1;
          goto LAB_0010d41c;
        }
        pcVar2 = pcVar4 + 4;
      } while (pcVar4[2] != '\0');
      pcVar4 = pcVar4 + 2;
    }
LAB_0010d41c:
    nLen = (int)pcVar4 - (int)zString;
  }
  if (nLen == 0) {
    iVar3 = 0;
  }
  else {
    pjVar1 = pCtx->pVm;
    iVar3 = (*(pjVar1->sVmConsumer).xConsumer)(zString,nLen,(pjVar1->sVmConsumer).pUserData);
    pjVar1->nOutputLen = pjVar1->nOutputLen + nLen;
  }
  return iVar3;
}

Assistant:

JX9_PRIVATE int jx9_context_output(jx9_context *pCtx, const char *zString, int nLen)
{
	SyString sData;
	int rc;
	if( nLen < 0 ){
		nLen = (int)SyStrlen(zString);
	}
	SyStringInitFromBuf(&sData, zString, nLen);
	rc = jx9VmOutputConsume(pCtx->pVm, &sData);
	return rc;
}